

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

VarSlice * __thiscall kratos::Var::operator[](Var *this,shared_ptr<kratos::Var> *var)

{
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *this_00;
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  Var *pVVar4;
  undefined1 auVar5 [8];
  int iVar6;
  shared_ptr<kratos::VarSlice> *s;
  pointer psVar7;
  Var *local_68;
  element_type *local_60;
  Var *local_58;
  shared_ptr<kratos::Var> *local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::VarVarSlice> var_slice;
  
  psVar7 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  local_50 = var;
  do {
    pVVar4 = local_58;
    if (psVar7 == psVar1) {
      this_00 = &local_58->slices_;
      local_68 = local_58;
      local_60 = (local_50->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<kratos::VarVarSlice,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<kratos::VarVarSlice>,kratos::Var*,kratos::Var*>
                ((__shared_ptr<kratos::VarVarSlice,(__gnu_cxx::_Lock_policy)2> *)local_48,
                 (allocator<kratos::VarVarSlice> *)
                 ((long)&var_slice.
                         super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),&local_68,&local_60);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarVarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)this_00,(shared_ptr<kratos::VarVarSlice> *)local_48);
      if (pVVar4->width_param_ != (Var *)0x0) {
        (*(((Var *)local_48)->super_IRNode)._vptr_IRNode[0x23])();
      }
      if (var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return (VarSlice *)local_48;
    }
    iVar6 = (*(((psVar7->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((char)iVar6 != '\0') {
      as<kratos::VarVarSlice>((Var *)local_48);
      auVar5 = local_48;
      peVar2 = (element_type *)
               (((VarSlice *)((long)local_48 + 0x298))->super_Var).super_IRNode._vptr_IRNode;
      peVar3 = (local_50->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (peVar2 == peVar3) {
        return (VarSlice *)auVar5;
      }
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

VarSlice &Var::operator[](const std::shared_ptr<Var> &var) {
    // if there is one already
    for (auto const &s : slices_) {
        if (s->sliced_by_var()) {
            auto const s_ = s->as<VarVarSlice>();
            if (s_->sliced_var() == var.get()) return *s_;
        }
    }
    auto var_slice = ::make_shared<VarVarSlice>(this, var.get());
    slices_.emplace_back(var_slice);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    return *var_slice;
}